

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::initPrograms
          (GeometryOutputCountTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference __b;
  int *piVar5;
  int local_654;
  string local_5e8;
  ShaderSource local_5c8;
  allocator<char> local_599;
  string local_598;
  ostringstream local_578 [8];
  ostringstream src_2;
  string local_400;
  ShaderSource local_3e0;
  allocator<char> local_3b1;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream src_1;
  undefined1 local_210 [4];
  int max_vertices;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  GeometryOutputCountTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 a_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in highp vec4 a_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_geom_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  poVar1 = std::operator<<(poVar1,"\tv_geom_FragColor = a_color;\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vertex",&local_1c1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,(string *)local_210);
  glu::ProgramSources::operator<<(pPVar2,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_pattern);
  if (sVar3 == 2) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,0);
    __b = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,1);
    piVar5 = std::max<int>(pvVar4,__b);
    local_654 = *piVar5;
  }
  else {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,0);
    local_654 = *pvVar4;
  }
  std::__cxx11::ostringstream::ostringstream(local_390);
  poVar1 = std::operator<<((ostream *)local_390,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"#extension GL_EXT_geometry_shader : require\n");
  poVar1 = std::operator<<(poVar1,
                           "#extension GL_OES_texture_storage_multisample_2d_array : require\n");
  poVar1 = std::operator<<(poVar1,"layout(points) in;\n");
  poVar1 = std::operator<<(poVar1,"layout(triangle_strip, max_vertices = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_654);
  poVar1 = std::operator<<(poVar1,") out;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp float rowHeight = 2.0 / float(");
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_pattern);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
  poVar1 = std::operator<<(poVar1,");\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp float colWidth = 2.0 / float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_654);
  std::operator<<(poVar1,");\n");
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_pattern);
  if (sVar3 == 2) {
    poVar1 = std::operator<<((ostream *)local_390,
                             "\thighp int emitCount = (gl_PrimitiveIDIn == 0) ? (");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar4);
    poVar1 = std::operator<<(poVar1,") : (");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar4);
    std::operator<<(poVar1,");\n");
  }
  else {
    poVar1 = std::operator<<((ostream *)local_390,"\thighp int emitCount = ");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_pattern,0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar4);
    std::operator<<(poVar1,";\n");
  }
  poVar1 = std::operator<<((ostream *)local_390,
                           "\tfor (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n");
  poVar1 = std::operator<<(poVar1,"\t{\n");
  poVar1 = std::operator<<(poVar1,
                           "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
                          );
  poVar1 = std::operator<<(poVar1,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n");
  poVar1 = std::operator<<(poVar1,"\t\tEmitVertex();\n");
  poVar1 = std::operator<<(poVar1,
                           "\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
                          );
  poVar1 = std::operator<<(poVar1,"\t\tv_frag_FragColor = v_geom_FragColor[0];\n");
  poVar1 = std::operator<<(poVar1,"\t\tEmitVertex();\n");
  poVar1 = std::operator<<(poVar1,"\t}\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"geometry",&local_3b1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_3b0);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_3e0,&local_400);
  glu::ProgramSources::operator<<(pPVar2,&local_3e0);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::ostringstream::~ostringstream(local_390);
  std::__cxx11::ostringstream::ostringstream(local_578);
  poVar1 = std::operator<<((ostream *)local_578,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tfragColor = v_frag_FragColor;\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"fragment",&local_599);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_598);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_5c8,&local_5e8);
  glu::ProgramSources::operator<<(pPVar2,&local_5c8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::ostringstream::~ostringstream(local_578);
  return;
}

Assistant:

void GeometryOutputCountTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n"
			<<"layout(location = 0) out highp vec4 v_geom_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	gl_Position = a_position;\n"
			<<"	v_geom_FragColor = a_color;\n"
			<<"}\n";
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		const int max_vertices = m_pattern.size() == 2 ? std::max(m_pattern[0], m_pattern[1]) : m_pattern[0];

		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "#extension GL_OES_texture_storage_multisample_2d_array : require\n"
			<< "layout(points) in;\n"
			<< "layout(triangle_strip, max_vertices = " << max_vertices << ") out;\n"
			<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
			<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	const highp float rowHeight = 2.0 / float(" << m_pattern.size() << ");\n"
			<< "	const highp float colWidth = 2.0 / float(" << max_vertices << ");\n";

		if (m_pattern.size() == 2)
			src	<< "	highp int emitCount = (gl_PrimitiveIDIn == 0) ? (" << m_pattern[0] << ") : (" << m_pattern[1] << ");\n";
		else
			src	<< "	highp int emitCount = " << m_pattern[0] << ";\n";
		src	<< "	for (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n"
			<< "	{\n"
			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "		gl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n"
			<< "		v_frag_FragColor = v_geom_FragColor[0];\n"
			<< "		EmitVertex();\n"

			<< "	}\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out mediump vec4 fragColor;\n"
			<<"layout(location = 0) in highp vec4 v_frag_FragColor;\n"
			<<"void main (void)\n"
			<<"{\n"
			<<"	fragColor = v_frag_FragColor;\n"
			<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}